

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_leaveExpiredVariable_Test::TestBody(Variable_leaveExpiredVariable_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_e0 [2];
  AssertHelper local_c0 [8];
  Message local_b8 [15];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78 [8];
  Message local_70 [15];
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  undefined1 local_40 [8];
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  Variable_leaveExpiredVariable_Test *this_local;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_40);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar1 = libcellml::Variable::hasEquivalentVariable((shared_ptr *)peVar3,(bool)((char)&v3 + '\b'));
  local_61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_60,"v1->hasEquivalentVariable(v2)",
               "true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x526,pcVar4);
    testing::internal::AssertHelper::operator=(local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar1 = libcellml::Variable::hasEquivalentVariable((shared_ptr *)peVar3,SUB81(local_40,0));
  local_a9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_e0,local_a8,"v1->hasEquivalentVariable(v3)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x527,pcVar4);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_40);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, leaveExpiredVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    v2.reset();
    libcellml::Variable::addEquivalence(v1, v3);
    EXPECT_FALSE(v1->hasEquivalentVariable(v2));
    EXPECT_TRUE(v1->hasEquivalentVariable(v3));
}